

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Vector2i __thiscall
sf::RenderTarget::mapCoordsToPixel(RenderTarget *this,Vector2f *point,View *view)

{
  Vector2i VVar1;
  RenderTarget *in_RDX;
  Vector2f view_00;
  IntRect IVar2;
  IntRect viewport;
  Vector2f normalized;
  Vector2i pixel;
  Transform *in_stack_ffffffffffffffb8;
  int local_38;
  int iStack_34;
  int local_30;
  int iStack_2c;
  Vector2<int> local_8;
  
  View::getTransform((View *)point);
  view_00 = Transform::transformPoint(in_stack_ffffffffffffffb8,(Vector2f *)0x156d84);
  Vector2<int>::Vector2(&local_8);
  IVar2 = getViewport(in_RDX,(View *)view_00);
  local_30 = IVar2.width;
  local_38 = IVar2.left;
  iStack_2c = IVar2.height;
  iStack_34 = IVar2.top;
  VVar1.y = (int)(((-view_00.y + 1.0) / 2.0) * (float)iStack_2c + (float)iStack_34);
  VVar1.x = (int)(((view_00.x + 1.0) / 2.0) * (float)local_30 + (float)local_38);
  return VVar1;
}

Assistant:

Vector2i RenderTarget::mapCoordsToPixel(const Vector2f& point, const View& view) const
{
    // First, transform the point by the view matrix
    Vector2f normalized = view.getTransform().transformPoint(point);

    // Then convert to viewport coordinates
    Vector2i pixel;
    IntRect viewport = getViewport(view);
    pixel.x = static_cast<int>(( normalized.x + 1.f) / 2.f * viewport.width  + viewport.left);
    pixel.y = static_cast<int>((-normalized.y + 1.f) / 2.f * viewport.height + viewport.top);

    return pixel;
}